

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O0

char * get_node_value(IXML_Node *node)

{
  long lVar1;
  char *text_value;
  IXML_Node *text_node;
  IXML_Node *node_local;
  
  lVar1 = ixmlNode_getFirstChild(node);
  if (lVar1 == 0) {
    node_local = (IXML_Node *)0x0;
  }
  else {
    node_local = (IXML_Node *)ixmlNode_getNodeValue(lVar1);
  }
  return (char *)node_local;
}

Assistant:

static const DOMString get_node_value(IXML_Node *node)
{
	IXML_Node *text_node = NULL;
	const DOMString text_value = NULL;

	text_node = ixmlNode_getFirstChild(node);
	if (text_node == NULL) {
		return NULL;
	}

	text_value = ixmlNode_getNodeValue(text_node);
	return text_value;
}